

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O0

void helper_msa_copy_s_h_mips64(CPUMIPSState_conflict5 *env,uint32_t rd,uint32_t ws,uint32_t n)

{
  uint32_t n_local;
  uint32_t ws_local;
  uint32_t rd_local;
  CPUMIPSState_conflict5 *env_local;
  
  (env->active_tc).gpr[rd] =
       (long)*(short *)((long)(env->active_fpu).fpr + (ulong)(n & 7) * 2 + (ulong)ws * 0x10);
  return;
}

Assistant:

void helper_msa_copy_s_h(CPUMIPSState *env, uint32_t rd,
                         uint32_t ws, uint32_t n)
{
    n %= 8;
#if defined(HOST_WORDS_BIGENDIAN)
    if (n < 4) {
        n = 4 - n - 1;
    } else {
        n = 12 - n - 1;
    }
#endif
    env->active_tc.gpr[rd] = (int16_t)env->active_fpu.fpr[ws].wr.h[n];
}